

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpRegisterClient(Upnp_FunPtr Fun,void *Cookie,UpnpClient_Handle *Hnd)

{
  int iVar1;
  undefined4 *puVar2;
  Handle_Info *HInfo;
  UpnpClient_Handle *Hnd_local;
  void *Cookie_local;
  Upnp_FunPtr Fun_local;
  
  if (UpnpSdkInit == 1) {
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x616,"Inside UpnpRegisterClient \n");
    if ((Fun == (Upnp_FunPtr)0x0) || (Hnd == (UpnpClient_Handle *)0x0)) {
      Fun_local._4_4_ = -0x65;
    }
    else {
      HandleLock(".upnp/src/api/upnpapi.c",0x61b);
      if (UpnpSdkClientRegistered + UpnpSdkDeviceRegisteredV4 + UpnpSdkDeviceregisteredV6 < 199) {
        iVar1 = GetFreeHandle();
        *Hnd = iVar1;
        if (iVar1 == -0x66) {
          HandleUnlock(".upnp/src/api/upnpapi.c",0x623);
          Fun_local._4_4_ = -0x68;
        }
        else {
          puVar2 = (undefined4 *)malloc(0x2f0);
          if (puVar2 == (undefined4 *)0x0) {
            HandleUnlock(".upnp/src/api/upnpapi.c",0x628);
            Fun_local._4_4_ = -0x68;
          }
          else {
            *puVar2 = 0;
            *(Upnp_FunPtr *)(puVar2 + 2) = Fun;
            *(void **)(puVar2 + 4) = Cookie;
            *(undefined8 *)(puVar2 + 0xa2) = 0;
            ListInit((LinkedList *)(puVar2 + 0xa4),(cmp_routine)0x0,(free_function)0x0);
            puVar2[0x8e] = 0;
            puVar2[0x9e] = 0xffffffff;
            puVar2[0x9f] = 0xffffffff;
            HandleTable[*Hnd] = puVar2;
            UpnpSdkClientRegistered = UpnpSdkClientRegistered + 1;
            HandleUnlock(".upnp/src/api/upnpapi.c",0x637);
            UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x63c,"Exiting UpnpRegisterClient \n")
            ;
            Fun_local._4_4_ = 0;
          }
        }
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x61f);
        Fun_local._4_4_ = -0x78;
      }
    }
  }
  else {
    Fun_local._4_4_ = -0x74;
  }
  return Fun_local._4_4_;
}

Assistant:

int UpnpRegisterClient(
	Upnp_FunPtr Fun, const void *Cookie, UpnpClient_Handle *Hnd)
{
	struct Handle_Info *HInfo;

	if (UpnpSdkInit != 1)
		return UPNP_E_FINISH;
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpRegisterClient \n");
	if (Fun == NULL || Hnd == NULL)
		return UPNP_E_INVALID_PARAM;

	HandleLock(__FILE__, __LINE__);
	if ((NUM_HANDLE - 1) <=
		(UpnpSdkClientRegistered + UpnpSdkDeviceRegisteredV4 +
			UpnpSdkDeviceregisteredV6)) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_ALREADY_REGISTERED;
	}
	if ((*Hnd = GetFreeHandle()) == UPNP_E_OUTOF_HANDLE) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_OUTOF_MEMORY;
	}
	HInfo = (struct Handle_Info *)malloc(sizeof(struct Handle_Info));
	if (HInfo == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_OUTOF_MEMORY;
	}
	HInfo->HType = HND_CLIENT;
	HInfo->Callback = Fun;
	HInfo->Cookie = (void *)Cookie;
	HInfo->ClientSubList = NULL;
	ListInit(&HInfo->SsdpSearchList, NULL, NULL);
	#ifdef INCLUDE_DEVICE_APIS
	HInfo->MaxAge = 0;
	HInfo->MaxSubscriptions = UPNP_INFINITE;
	HInfo->MaxSubscriptionTimeOut = UPNP_INFINITE;
	#endif
	HandleTable[*Hnd] = HInfo;
	UpnpSdkClientRegistered += 1;
	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpRegisterClient \n");

	return UPNP_E_SUCCESS;
}